

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::SpotLightSource::readFrom(SpotLightSource *this,BinaryReader *binary)

{
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->from);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->to);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->I);
  (*(this->Ispectrum).super_Entity._vptr_Entity[2])(&this->Ispectrum,binary);
  BinaryReader::read<float,void>(binary,&this->coneAngle);
  BinaryReader::read<float,void>(binary,&this->coneDeltaAngle);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->scale);
  return;
}

Assistant:

void SpotLightSource::readFrom(BinaryReader &binary) 
  {
    binary.read(from);
    binary.read(to);
    binary.read(I);
    binary.read(Ispectrum);
    binary.read(coneAngle);
    binary.read(coneDeltaAngle);
    binary.read(scale);
  }